

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasdreamOptimizationTests.cpp
# Opt level: O3

bool TasOptimization::testGradientDescentState(bool verbose)

{
  vector<double,_std::allocator<double>_> *this;
  undefined1 auVar1 [16];
  pointer pdVar2;
  pointer pdVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  char *pcVar7;
  pointer pdVar8;
  pointer __dest;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  vector<double,_std::allocator<double>_> compare_x;
  vector<double,_std::allocator<double>_> new_x;
  GradientDescentState state;
  vector<double,_std::allocator<double>_> local_c0;
  vector<double,_std::allocator<double>_> local_a8;
  GradientDescentState local_88;
  vector<double,_std::allocator<double>_> local_68;
  double local_50;
  int local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)operator_new(0x28);
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + 5;
  lVar4 = 0;
  do {
    auVar9._8_4_ = (int)lVar4;
    auVar9._0_8_ = lVar4;
    auVar9._12_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar9 = (auVar9 | _DAT_0011b8a0) ^ _DAT_0011b8b0;
    if (auVar9._4_4_ == -0x80000000 && auVar9._0_4_ < -0x7ffffffb) {
      local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar4] = 1.0;
      local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar4 + 1] = 1.0;
    }
    lVar4 = lVar4 + 2;
  } while (lVar4 != 6);
  local_48 = -0x80000000;
  uStack_44 = 0x80000000;
  uStack_40 = 0x80000000;
  uStack_3c = 0x80000000;
  this = &local_88.x;
  local_88.adaptive_stepsize = 0.1;
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  std::vector<double,_std::allocator<double>_>::vector(this,&local_68);
  pdVar3 = local_88.x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar2 = local_88.x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_50 = local_88.adaptive_stepsize;
  std::vector<double,_std::allocator<double>_>::vector(&local_c0,this);
  bVar6 = local_50 == 0.1;
  lVar4 = (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<double,_std::allocator<double>_>::vector(&local_c0,this);
  pdVar8 = local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __dest = local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar6 = (lVar4 == 0x28 && (long)pdVar3 - (long)pdVar2 == 0x28) && bVar6;
  lVar4 = (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  if (local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    lVar5 = 0;
    do {
      bVar6 = (bool)(bVar6 & local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar5] ==
                             local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar5]);
      lVar5 = lVar5 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
    if ((long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      memset(local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,0,
             (((long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start) - 8U & 0xfffffffffffffff8) + 8);
    }
  }
  if ((long)local_88.x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_88.x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    memmove(__dest,local_88.x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start,
            (long)local_88.x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_88.x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start);
    lVar4 = (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    pdVar8 = local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    __dest = local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  if (pdVar8 != __dest) {
    lVar5 = 0;
    do {
      bVar6 = (bool)(bVar6 & __dest[lVar5] ==
                             local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar5]);
      lVar5 = lVar5 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
    if (pdVar8 != __dest) {
      memset(__dest,0,((long)pdVar8 + (-8 - (long)__dest) & 0xfffffffffffffff8U) + 8);
    }
  }
  std::vector<double,_std::allocator<double>_>::operator=(&local_c0,this);
  if ((long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    lVar4 = (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    lVar5 = 0;
    do {
      bVar6 = (bool)(bVar6 & local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar5] ==
                             local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar5]);
      lVar5 = lVar5 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
  }
  local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)operator_new(0x28);
  auVar1 = _DAT_0011b8b0;
  auVar9 = _DAT_0011b8a0;
  local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + 5;
  lVar4 = 0;
  do {
    auVar10._8_4_ = (int)lVar4;
    auVar10._0_8_ = lVar4;
    auVar10._12_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar10 = (auVar10 | auVar9) ^ auVar1;
    if (auVar10._4_4_ == local_48 && auVar10._0_4_ < -0x7ffffffb) {
      local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar4] = 2.0;
      local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar4 + 1] = 2.0;
    }
    lVar4 = lVar4 + 2;
  } while (lVar4 != 6);
  local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  GradientDescentState::setX(&local_88,&local_a8);
  std::vector<double,_std::allocator<double>_>::operator=(&local_c0,this);
  if ((long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    lVar4 = (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    lVar5 = 0;
    do {
      bVar6 = (bool)(bVar6 & local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar5] ==
                             local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar5]);
      lVar5 = lVar5 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
    if ((long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      memset(local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,0,
             (((long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start) - 8U & 0xfffffffffffffff8) + 8);
    }
  }
  if ((long)local_88.x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_88.x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    memmove(local_88.x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start,
            local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start,
            (long)local_88.x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_88.x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start);
  }
  std::vector<double,_std::allocator<double>_>::operator=(&local_c0,this);
  if ((long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    lVar4 = (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    lVar5 = 0;
    do {
      bVar6 = (bool)(bVar6 & local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar5] ==
                             local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar5]);
      lVar5 = lVar5 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
    if ((long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      memset(local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,0,
             (((long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start) - 8U & 0xfffffffffffffff8) + 8);
    }
  }
  local_88.adaptive_stepsize = 0.2;
  if ((byte)(bVar6 ^ 1U | verbose) == 1) {
    *(undefined8 *)(&TasDREAM::LikelihoodGaussIsotropic::vtable + *(long *)(std::cout + -0x18)) =
         0x14;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Gradient Descent",0x10);
    *(undefined8 *)(&TasDREAM::LikelihoodGaussIsotropic::vtable + *(long *)(std::cout + -0x18)) =
         0x1e;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"State Unit Tests",0x10);
    *(undefined8 *)(&TasDREAM::LikelihoodGaussIsotropic::vtable + *(long *)(std::cout + -0x18)) =
         0xf;
    pcVar7 = "FAIL";
    if (bVar6 != false) {
      pcVar7 = "Pass";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7,4);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
  }
  if (local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_88.x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_88.x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar6;
}

Assistant:

bool testGradientDescentState(bool verbose) {
    test_result test;

    // Check contructor.
    size_t num_dimensions = 5;
    std::vector<double> dummy_x(num_dimensions, 1);
    GradientDescentState state = GradientDescentState(dummy_x, 0.1);
    test.tassert(num_dimensions == state.getNumDimensions());
    test.tassert(state.getAdaptiveStepsize() == 0.1);
    test.tassert(state.getX().size() == num_dimensions);

    // Check getters and coverters.
    std::vector<double> compare_x = state.getX();
    for (size_t i=0; i<compare_x.size(); i++) test.tassert(compare_x[i] == dummy_x[i]);
    std::fill(compare_x.begin(), compare_x.end(), 0);
    state.getX(compare_x.data());
    for (size_t i=0; i<compare_x.size(); i++) test.tassert(compare_x[i] == dummy_x[i]);
    std::fill(compare_x.begin(), compare_x.end(), 0);
    compare_x = state;
    for (size_t i=0; i<compare_x.size(); i++) test.tassert(compare_x[i] == dummy_x[i]);

    // Check setters.
    std::vector<double> new_x(num_dimensions, 2);
    state.setX(new_x);
    compare_x = state;
    for (size_t i=0; i<compare_x.size(); i++) test.tassert(new_x[i] == compare_x[i]);
    std::fill(compare_x.begin(), compare_x.end(), 0);
    state.setX(new_x.data());
    compare_x = state;
    for (size_t i=0; i<compare_x.size(); i++) test.tassert(new_x[i] == compare_x[i]);
    std::fill(compare_x.begin(), compare_x.end(), 0);
    state.setAdaptiveStepsize(0.2);
    test.tassert(state.getAdaptiveStepsize() == 0.2);

    // Reporting.
    if (test.failed_any() or verbose) reportPassFail(test.success(), "Gradient Descent", "State Unit Tests");
    return test.success();
}